

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>::Assemble
          (TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_> *this,
          TPZBaseMatrix *stiff_base,TPZBaseMatrix *rhs_base,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZCompMesh *pTVar1;
  TPZCompEl *el;
  bool bVar2;
  int matid;
  long lVar3;
  TPZMatrix<double> *stiffness;
  TPZFMatrix<double> *rhs;
  int64_t size;
  TPZCompEl **ppTVar4;
  long *plVar5;
  ostream *poVar6;
  long nelem;
  long lVar7;
  long lVar8;
  int local_86d4;
  TPZVec<int> elorder;
  TPZElementMatrixT<double> ef;
  TPZElementMatrixT<double> ek;
  
  lVar3 = __dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  if (lVar3 != 0) {
    lVar3 = __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0);
    if (lVar3 == 0) {
      stiffness = (TPZMatrix<double> *)
                  __dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0)
      ;
      if (stiffness != (TPZMatrix<double> *)0x0) {
        rhs = (TPZFMatrix<double> *)
              __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0);
        if (rhs != (TPZFMatrix<double> *)0x0) {
          pTVar1 = (this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh;
          lVar3 = (pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
          TPZElementMatrixT<double>::TPZElementMatrixT(&ek,pTVar1,EK);
          TPZElementMatrixT<double>::TPZElementMatrixT
                    (&ef,(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh,EF);
          pTVar1 = (this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh;
          size = TPZCompMesh::NEquations(pTVar1);
          local_86d4 = 0;
          TPZVec<int>::TPZVec(&elorder,size,&local_86d4);
          OrderElement(this);
          lVar7 = 0;
          if (0 < lVar3) {
            lVar7 = lVar3;
          }
          lVar8 = 0;
          lVar3 = 0;
          do {
            if (lVar7 == lVar3) {
              TPZVec<int>::~TPZVec(&elorder);
              TPZElementMatrixT<double>::~TPZElementMatrixT(&ef);
              TPZElementMatrixT<double>::~TPZElementMatrixT(&ek);
              return;
            }
            nelem = (long)*(int *)(*(long *)&this->field_0xb0 + lVar3 * 4);
            if (-1 < nelem) {
              ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                                  (&(pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,
                                   nelem);
              el = *ppTVar4;
              if (el != (TPZCompEl *)0x0) {
                plVar5 = (long *)(**(code **)(*(long *)el + 0xb8))(el);
                if (plVar5 != (long *)0x0) {
                  matid = (**(code **)(*plVar5 + 0x58))(plVar5);
                  bVar2 = ::TPZStructMatrix::ShouldCompute((TPZStructMatrix *)this,matid);
                  if (!bVar2) goto LAB_011bf85c;
                }
                (**(code **)(*(long *)el + 0x108))(el,&ek,&ef);
                poVar6 = std::operator<<((ostream *)&std::cout," assemblando elemento frontal ");
                poVar6 = std::ostream::_M_insert<long>((long)poVar6);
                std::endl<char,std::char_traits<char>>(poVar6);
                AssembleElement(this,el,&ek.super_TPZElementMatrix,&ef.super_TPZElementMatrix,
                                stiffness,rhs);
                if (this->f_quiet == 0) {
                  std::operator<<((ostream *)&std::cout,'*');
                  if (lVar8 % 0x14 == 0) {
                    poVar6 = std::operator<<((ostream *)&std::cout," ");
                    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
                    poVar6 = std::operator<<(poVar6,"% Elements assembled ");
                    std::endl<char,std::char_traits<char>>(poVar6);
                    std::ostream::flush();
                  }
                }
                lVar8 = lVar8 + 1;
              }
            }
LAB_011bf85c:
            lVar3 = lVar3 + 1;
          } while( true );
        }
      }
      __cxa_bad_cast();
    }
  }
  std::operator<<((ostream *)&std::cerr,
                  "virtual void TPZFrontStructMatrix<TPZFrontNonSym<double>>::Assemble(TPZBaseMatrix &, TPZBaseMatrix &, TPZAutoPointer<TPZGuiInterface>) [TFront = TPZFrontNonSym<double>, TVar = double, TPar = TPZStructMatrixOR<STATE>]"
                 );
  std::operator<<((ostream *)&std::cerr," incompatible types. Aborting...\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZFrontStructMatrix.cpp"
             ,0x145);
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::Assemble(TPZBaseMatrix & stiff_base, TPZBaseMatrix & rhs_base, TPZAutoPointer<TPZGuiInterface> guiInterface){
    if(!dynamic_cast<TPZMatrix<TVar>*>(&stiff_base) ||
       dynamic_cast<TPZFMatrix<TVar>*>(&rhs_base)){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" incompatible types. Aborting...\n";
        DebugStop();
    }
	auto& stiffness = dynamic_cast<TPZMatrix<TVar>&>(stiff_base);
    auto& rhs = dynamic_cast<TPZFMatrix<TVar>&>(rhs_base);
	int64_t iel;
	int64_t numel = 0, nelem = this->fMesh->NElements();
	TPZElementMatrixT<TVar> ek(this->fMesh,TPZElementMatrix::EK),ef(this->fMesh,TPZElementMatrix::EF);
	
	TPZAdmChunkVector<TPZCompEl *> &elementvec = this->fMesh->ElementVec();
	
	
	/**Rearange elements order*/
	TPZVec<int> elorder(this->fMesh->NEquations(),0);
	
	OrderElement();
	
	for(iel=0; iel < nelem; iel++) {
		
        int64_t elindex = fElementOrder[iel];
		if(elindex < 0) continue;
		TPZCompEl *el = elementvec[elindex];
		if(!el) continue;
		TPZMaterial * mat = el->Material();
		if(mat)
		{
			int matid = mat->Id();
			if(this->ShouldCompute(matid) == false)
			{
				continue;
			}
		}
		else
		{
		}
		
		//		int dim = el->NumNodes();
		
		//Builds elements stiffness matrix
		el->CalcStiff(ek,ef);
		
		
		std::cout<< " assemblando elemento frontal " << iel <<std::endl;
		
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness Frontal",sout);
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		
		AssembleElement(el, ek, ef, stiffness, rhs);
#ifdef PZ_LOG
		if(loggerel.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness depois de assemblada ",sout);
			LOGPZ_DEBUG(loggerel,sout.str())
		}
#endif
		
		if(!f_quiet)
		{
			cout << '*';
			if(!(numel%20)) {
				cout << " " << (100*iel/nelem) << "% Elements assembled " << endl;
				cout.flush();
			}
		}
		numel++;
		
	}//fim for iel
	
}